

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O1

void __thiscall Inferences::CompositeSGI::~CompositeSGI(CompositeSGI *this)

{
  GeneratingInferenceEngine **ppGVar1;
  SimplifyingGeneratingInference **ppSVar2;
  ulong uVar3;
  GeneratingInferenceEngine **ppGVar4;
  SimplifyingGeneratingInference **ppSVar5;
  
  (this->super_SimplifyingGeneratingInference).super_InferenceEngine._vptr_InferenceEngine =
       (_func_int **)&PTR__CompositeSGI_00b65888;
  ppGVar1 = (this->_generators)._cursor;
  for (ppGVar4 = (this->_generators)._stack; ppGVar4 != ppGVar1; ppGVar4 = ppGVar4 + 1) {
    if (*ppGVar4 != (GeneratingInferenceEngine *)0x0) {
      (*((*ppGVar4)->super_SimplifyingGeneratingInference).super_InferenceEngine.
        _vptr_InferenceEngine[1])();
    }
  }
  ppSVar2 = (this->_simplifiers)._cursor;
  for (ppSVar5 = (this->_simplifiers)._stack; ppSVar5 != ppSVar2; ppSVar5 = ppSVar5 + 1) {
    if (*ppSVar5 != (SimplifyingGeneratingInference *)0x0) {
      (*((*ppSVar5)->super_InferenceEngine)._vptr_InferenceEngine[1])();
    }
  }
  ppGVar4 = (this->_generators)._stack;
  if (ppGVar4 != (GeneratingInferenceEngine **)0x0) {
    uVar3 = (this->_generators)._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar3 == 0) {
      *ppGVar4 = (GeneratingInferenceEngine *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppGVar4;
    }
    else if (uVar3 < 0x11) {
      *ppGVar4 = (GeneratingInferenceEngine *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppGVar4;
    }
    else if (uVar3 < 0x19) {
      *ppGVar4 = (GeneratingInferenceEngine *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppGVar4;
    }
    else if (uVar3 < 0x21) {
      *ppGVar4 = (GeneratingInferenceEngine *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppGVar4;
    }
    else if (uVar3 < 0x31) {
      *ppGVar4 = (GeneratingInferenceEngine *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppGVar4;
    }
    else if (uVar3 < 0x41) {
      *ppGVar4 = (GeneratingInferenceEngine *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppGVar4;
    }
    else {
      operator_delete(ppGVar4,0x10);
    }
  }
  ppSVar5 = (this->_simplifiers)._stack;
  if (ppSVar5 != (SimplifyingGeneratingInference **)0x0) {
    uVar3 = (this->_simplifiers)._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar3 == 0) {
      *ppSVar5 = (SimplifyingGeneratingInference *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppSVar5;
    }
    else if (uVar3 < 0x11) {
      *ppSVar5 = (SimplifyingGeneratingInference *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppSVar5;
    }
    else if (uVar3 < 0x19) {
      *ppSVar5 = (SimplifyingGeneratingInference *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppSVar5;
    }
    else if (uVar3 < 0x21) {
      *ppSVar5 = (SimplifyingGeneratingInference *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppSVar5;
    }
    else if (uVar3 < 0x31) {
      *ppSVar5 = (SimplifyingGeneratingInference *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppSVar5;
    }
    else if (uVar3 < 0x41) {
      *ppSVar5 = (SimplifyingGeneratingInference *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppSVar5;
    }
    else {
      operator_delete(ppSVar5,0x10);
    }
  }
  (this->super_SimplifyingGeneratingInference).super_InferenceEngine._vptr_InferenceEngine =
       (_func_int **)&PTR__InferenceEngine_00b65968;
  return;
}

Assistant:

CompositeSGI::~CompositeSGI() {
  for (auto gen : _generators) {
    delete gen;
  }
  for (auto simpl : _simplifiers) {
    delete simpl;
  }
}